

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

value_type
simpson_int<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
          (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> first,
          __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> last)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  bool bVar1;
  difference_type dVar2;
  reference pfVar3;
  difference_type n;
  value_type sum;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffffc8
  ;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffffd0
  ;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_ffffffffffffffd8;
  long lVar4;
  uint in_stack_ffffffffffffffe0;
  float fVar5;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_10;
  float local_4;
  
  bVar1 = __gnu_cxx::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_4 = 0.0;
  }
  else {
    fVar5 = 0.0;
    __first._M_current._4_4_ = 0;
    __first._M_current._0_4_ = in_stack_ffffffffffffffe0;
    dVar2 = std::
            distance<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                      (__first,in_stack_ffffffffffffffd8);
    if (dVar2 % 2 == 0) {
      pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_10);
      fVar5 = (*pfVar3 * 3.0) / 8.0 + fVar5;
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&local_10);
      pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_10);
      fVar5 = (*pfVar3 * 9.0) / 8.0 + fVar5;
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&local_10);
      pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_10);
      fVar5 = (*pfVar3 * 9.0) / 8.0 + fVar5;
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&local_10);
      pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_10);
      fVar5 = (*pfVar3 * 3.0) / 8.0 + fVar5;
      dVar2 = dVar2 + -3;
    }
    local_4 = fVar5;
    if (2 < dVar2) {
      fVar5 = fVar5 * 3.0;
      pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_10);
      fVar5 = *pfVar3 + fVar5;
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&local_10);
      while (lVar4 = dVar2 + -1, 0 < lVar4) {
        pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_10);
        fVar5 = *pfVar3 * 4.0 + fVar5;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_10);
        dVar2 = lVar4 + -1;
        if (dVar2 == 1) {
          pfVar3 = __gnu_cxx::
                   __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                   operator*(&local_10);
          fVar5 = *pfVar3 + fVar5;
        }
        else {
          pfVar3 = __gnu_cxx::
                   __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                   operator*(&local_10);
          fVar5 = *pfVar3 + *pfVar3 + fVar5;
        }
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_10);
      }
      local_4 = fVar5 / 3.0;
    }
  }
  return local_4;
}

Assistant:

typename std::iterator_traits<iter>::value_type simpson_int(iter first, iter last) {
  typedef typename std::iterator_traits<iter>::value_type value_type;
  if (first == last)
    return value_type{0};
  value_type sum{0};
  auto n{std::distance(first, last)};
  if (n % 2 == 0) {  // Pulcherima (3/8 rule) for even number of data points
    sum += (*first) * value_type(3) / value_type(8);
    ++first;
    sum += (*first) * value_type(9) / value_type(8);
    ++first;
    sum += (*first) * value_type(9) / value_type(8);
    ++first;
    sum += (*first) * value_type(3) / value_type(8);
    n -= 3;
  }
  if (n > 2) {
    sum *= value_type(3);
    sum += *first;
    ++first;
    --n;
    while (n > 0) {
      sum += value_type(4) * (*first);
      ++first;
      --n;
      if (n == 1)
        sum += (*first);
      else
        sum += value_type(2) * (*first);
      ++first;
      --n;
    }
    sum /= value_type(3);
  }
  return sum;
}